

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

int event_remove_timer(event *ev)

{
  int res;
  event *ev_local;
  
  if (ev->ev_base == (event_base *)0x0) {
    event_warnx("%s: event has no event_base set.","event_remove_timer");
    ev_local._4_4_ = -1;
  }
  else {
    if (ev->ev_base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,ev->ev_base->th_base_lock);
    }
    ev_local._4_4_ = event_remove_timer_nolock_(ev);
    if (ev->ev_base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,ev->ev_base->th_base_lock);
    }
  }
  return ev_local._4_4_;
}

Assistant:

int
event_remove_timer(struct event *ev)
{
	int res;

	if (EVUTIL_FAILURE_CHECK(!ev->ev_base)) {
		event_warnx("%s: event has no event_base set.", __func__);
		return -1;
	}

	EVBASE_ACQUIRE_LOCK(ev->ev_base, th_base_lock);

	res = event_remove_timer_nolock_(ev);

	EVBASE_RELEASE_LOCK(ev->ev_base, th_base_lock);

	return (res);
}